

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager.cpp
# Opt level: O2

void __thiscall
QRestAccessManagerPrivate::verifyThreadAffinity
          (QRestAccessManagerPrivate *this,QObject *contextObject)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = QThread::currentThread();
  lVar2 = QObject::thread();
  if (lVar1 != lVar2) {
    QtPrivateLogging::lcQrest();
    if (((byte)QtPrivateLogging::lcQrest::category.field_2.bools.enabledWarning._q_value._M_base.
               _M_i & 1) != 0) {
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      local_28 = QtPrivateLogging::lcQrest::category.name;
      QMessageLogger::warning
                (local_40,"QRestAccessManager can only be called in the thread it belongs to");
    }
  }
  if (contextObject != (QObject *)0x0) {
    lVar1 = QObject::thread();
    lVar2 = QObject::thread();
    if (lVar1 != lVar2) {
      QtPrivateLogging::lcQrest();
      if (((byte)QtPrivateLogging::lcQrest::category.field_2.bools.enabledWarning._q_value._M_base.
                 _M_i & 1) != 0) {
        local_40[0] = '\x02';
        local_40[1] = '\0';
        local_40[2] = '\0';
        local_40[3] = '\0';
        local_40[4] = '\0';
        local_40[5] = '\0';
        local_40[6] = '\0';
        local_40[7] = '\0';
        local_40[8] = '\0';
        local_40[9] = '\0';
        local_40[10] = '\0';
        local_40[0xb] = '\0';
        local_40[0xc] = '\0';
        local_40[0xd] = '\0';
        local_40[0xe] = '\0';
        local_40[0xf] = '\0';
        local_40[0x10] = '\0';
        local_40[0x11] = '\0';
        local_40[0x12] = '\0';
        local_40[0x13] = '\0';
        local_40[0x14] = '\0';
        local_40[0x15] = '\0';
        local_40[0x16] = '\0';
        local_40[0x17] = '\0';
        local_28 = QtPrivateLogging::lcQrest::category.name;
        QMessageLogger::warning
                  (local_40,"QRestAccessManager: the context object must reside in the same thread")
        ;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRestAccessManagerPrivate::verifyThreadAffinity(const QObject *contextObject)
{
    Q_Q(QRestAccessManager);
    if (QThread::currentThread() != q->thread()) {
        qCWarning(lcQrest, "QRestAccessManager can only be called in the thread it belongs to");
        Q_ASSERT(false);
    }
    if (contextObject && (contextObject->thread() != q->thread())) {
        qCWarning(lcQrest, "QRestAccessManager: the context object must reside in the same thread");
        Q_ASSERT(false);
    }
}